

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

uint __thiscall cppforth::Forth::ForthStack<unsigned_int>::getTop(ForthStack<unsigned_int> *this)

{
  pointer puVar1;
  AbortException *this_00;
  
  puVar1 = (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)this->top <
      (ulong)((long)(this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    return puVar1[this->top];
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  AbortException::AbortException(this_00,"Forth stack overflow");
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CellType getTop(){
				if ( (top) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				return stack.at(top);
			}